

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O3

expr_node * __thiscall expr_tree::cosDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *peVar1;
  expr_value local_20;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_20,2);
  expr_node::expr_node(this_00,'\x05',&local_20);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_20,9);
  expr_node::expr_node(peVar1,'\x05',&local_20);
  this_00->right = peVar1;
  peVar1 = Copy(node->right);
  this_00->right->right = peVar1;
  Link(this_00->right,(expr_node *)0x0,this_00->right->right);
  Link(this_00,(expr_node *)0x0,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::cosDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)SUB);
    deriv->right = new expr_node(OP, (long)SIN);
    deriv->right->right = Copy(node->right);
    Link(deriv->right, nullptr, deriv->right->right);
    Link(deriv, nullptr, deriv->right);
    return deriv;
}